

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O1

void __thiscall
cfd::core::ElementsConfidentialAddress::DecodeAddress
          (ElementsConfidentialAddress *this,string *confidential_address,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  value_type_conflict1 *__val;
  CfdException *pCVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *wally_string;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  bool bVar6;
  string *key;
  pointer this_00;
  bool bVar7;
  int ret;
  uint32_t prefix;
  char *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  string hrp;
  string address;
  int local_2a8;
  bool local_2a1;
  pointer local_298;
  uint local_28c;
  string *local_288;
  WallyUtil *local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  ElementsConfidentialAddress *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  CfdSourceLocation local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  pointer local_218;
  string *local_210;
  _func_int **local_208;
  pointer local_200;
  string local_1f8;
  undefined1 local_1d8 [8];
  pointer puStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  uchar local_1b8 [16];
  pointer local_1a8;
  pointer local_190;
  pointer local_178;
  TapBranch local_160;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_e8;
  Script local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  local_60;
  ByteData local_48;
  
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260 = this;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x21);
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x21;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_280 = (WallyUtil *)0x0;
  local_288 = confidential_address;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (confidential_address->_M_string_length == 0) {
    local_1d8 = (undefined1  [8])0x220cb7;
    puStack_1d0 = (pointer)CONCAT44(puStack_1d0._4_4_,0x83);
    local_1c8._M_allocated_capacity = 0x21decb;
    logger::log<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
               "DecodeAddress error. confidential address empty. : address={}.",confidential_address
              );
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8 = (undefined1  [8])&local_1c8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"DecodeAddress confidential address empty.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1d8);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_2a8 = -1;
  local_28c = 0;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  this_00 = (prefix_list->
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_218 = (prefix_list->
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_2a1 = this_00 == local_218;
  if (local_2a1) {
    bVar6 = false;
  }
  else {
    local_210 = (string *)&local_260->address_;
    bVar6 = false;
    local_208 = (_func_int **)&PTR__TaprootScriptTree_0025af68;
    do {
      GetBlindKeyPair();
      local_200 = local_60.
                  super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar7 = local_60.
              super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_60.
              super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar7) {
        key = &(local_60.
                super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                ._M_impl.super__Vector_impl_data._M_start)->blinded_prefix_key;
        local_298 = this_00;
        do {
          local_280 = (WallyUtil *)0x0;
          if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
            AddressFormatData::GetString((string *)local_1d8,this_00,key);
            ::std::__cxx11::string::operator=((string *)&local_238,(string *)local_1d8);
            if (local_1d8 != (undefined1  [8])&local_1c8) {
              operator_delete((void *)local_1d8);
            }
            local_2a8 = wally_confidential_addr_segwit_to_ec_public_key
                                  ((confidential_address->_M_dataplus)._M_p,
                                   local_238._M_dataplus._M_p,
                                   local_278.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_278.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_278.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            wally_string = extraout_RDX;
            if (local_2a8 != 0) {
              local_1d8 = (undefined1  [8])0x220cb7;
              puStack_1d0._0_4_ = 0x9c;
              local_1c8._M_allocated_capacity = 0x21decb;
              logger::log<int&,std::__cxx11::string&>
                        ((CfdSourceLocation *)local_1d8,kCfdLogLevelTrace,
                         "fail libwally. ret={} prefix={}",&local_2a8,&local_238);
              local_1d8 = (undefined1  [8])0x220cb7;
              puStack_1d0 = (pointer)CONCAT44(puStack_1d0._4_4_,0x9e);
              local_1c8._M_allocated_capacity = 0x21decb;
              logger::log<std::__cxx11::string_const&>
                        ((CfdSourceLocation *)local_1d8,kCfdLogLevelTrace,"confidential_address={}",
                         confidential_address);
              wally_string = extraout_RDX_00;
              this_00 = local_298;
            }
          }
          else {
            local_28c = AddressFormatData::GetValue(this_00,key);
            local_2a8 = wally_confidential_addr_to_ec_public_key
                                  ((confidential_address->_M_dataplus)._M_p,local_28c,
                                   local_278.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_278.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_278.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            wally_string = extraout_RDX_01;
            if (local_2a8 != 0) {
              local_1d8 = (undefined1  [8])0x220cb7;
              puStack_1d0._0_4_ = 0xa9;
              local_1c8._M_allocated_capacity = 0x21decb;
              logger::log<int&,unsigned_int&>
                        ((CfdSourceLocation *)local_1d8,kCfdLogLevelTrace,
                         "fail libwally. ret={} prefix={}",&local_2a8,&local_28c);
              local_1d8 = (undefined1  [8])0x220cb7;
              puStack_1d0 = (pointer)CONCAT44(puStack_1d0._4_4_,0xac);
              local_1c8._M_allocated_capacity = 0x21decb;
              logger::log<std::__cxx11::string_const&>
                        ((CfdSourceLocation *)local_1d8,kCfdLogLevelTrace,"confidential_address={}",
                         confidential_address);
              wally_string = extraout_RDX_02;
              this_00 = local_298;
            }
          }
          _Var4._M_p = local_238._M_dataplus._M_p;
          if (local_2a8 == 0) {
            pcVar2 = (local_288->_M_dataplus)._M_p;
            if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
              AddressFormatData::GetString((string *)local_1d8,this_00,key + -1);
              local_2a8 = wally_confidential_addr_to_addr_segwit
                                    (pcVar2,_Var4._M_p,local_1d8,&local_280);
              wally_string = extraout_RDX_03;
              if (local_1d8 != (undefined1  [8])&local_1c8) {
                operator_delete((void *)local_1d8);
                wally_string = extraout_RDX_04;
              }
              if (local_2a8 != 0) {
                local_250.filename = "cfdcore_elements_address.cpp";
                local_250.line = 0xb9;
                local_250.funcname = "DecodeAddress";
                AddressFormatData::GetString((string *)local_1d8,this_00,key + -1);
                local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1d8;
                logger::log<int&,char_const*&>
                          (&local_250,kCfdLogLevelTrace,"fail libwally. ret={} prefix={}",&local_2a8
                           ,(char **)&local_258);
                wally_string = extraout_RDX_05;
                if (local_1d8 != (undefined1  [8])&local_1c8) {
                  operator_delete((void *)local_1d8);
                  wally_string = extraout_RDX_06;
                }
              }
            }
            else {
              local_2a8 = wally_confidential_addr_to_addr(pcVar2,local_28c,&local_280);
              wally_string = extraout_RDX_07;
              if (local_2a8 != 0) {
                local_1d8 = (undefined1  [8])0x220cb7;
                puStack_1d0 = (pointer)CONCAT44(puStack_1d0._4_4_,0xc1);
                local_1c8._M_allocated_capacity = 0x21decb;
                logger::log<int&,unsigned_int&>
                          ((CfdSourceLocation *)local_1d8,kCfdLogLevelTrace,
                           "fail libwally. ret={} prefix={}",&local_2a8,&local_28c);
                wally_string = extraout_RDX_08;
              }
            }
          }
          bVar3 = true;
          if (local_2a8 == 0) {
            WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_1d8,local_280,wally_string);
            ::std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1d8);
            if (local_1d8 != (undefined1  [8])&local_1c8) {
              operator_delete((void *)local_1d8);
            }
            core::Address::Address((Address *)local_1d8,&local_1f8,this_00);
            core::Address::operator=(&local_260->unblinded_address_,(Address *)local_1d8);
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_90);
            Script::~Script(&local_d0);
            local_160._vptr_TapBranch = local_208;
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                      (&local_e8);
            TapBranch::~TapBranch(&local_160);
            if (local_178 != (pointer)0x0) {
              operator_delete(local_178);
            }
            if (local_190 != (pointer)0x0) {
              operator_delete(local_190);
            }
            if (local_1a8 != (pointer)0x0) {
              operator_delete(local_1a8);
            }
            if ((uchar *)local_1c8._M_allocated_capacity != local_1b8) {
              operator_delete((void *)local_1c8._M_allocated_capacity);
            }
            ByteData::ByteData(&local_48,&local_278);
            Pubkey::Pubkey((Pubkey *)local_1d8,&local_48);
            puVar1 = (local_260->confidential_key_).data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            (local_260->confidential_key_).data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1d8;
            (local_260->confidential_key_).data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = puStack_1d0;
            (local_260->confidential_key_).data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._M_allocated_capacity;
            local_1d8 = (undefined1  [8])0x0;
            puStack_1d0 = (pointer)0x0;
            local_1c8._M_allocated_capacity = 0;
            if (puVar1 != (pointer)0x0) {
              operator_delete(puVar1);
            }
            if (local_1d8 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1d8);
            }
            if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            ::std::__cxx11::string::_M_assign(local_210);
            bVar3 = false;
          }
          bVar6 = true;
          confidential_address = local_288;
          if (!bVar3) break;
          bVar7 = (pointer)&key[1]._M_string_length == local_200;
          key = (string *)&key[2]._M_string_length;
        } while (!bVar7);
      }
      ::std::
      vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ::~vector(&local_60);
      if (!bVar7) break;
      this_00 = this_00 + 1;
      local_2a1 = this_00 == local_218;
    } while (!local_2a1);
  }
  if ((local_2a1 & 1U) == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  if (!bVar6) {
    local_1d8 = (undefined1  [8])0x220cb7;
    puStack_1d0 = (pointer)CONCAT44(puStack_1d0._4_4_,0xe1);
    local_1c8._M_allocated_capacity = 0x21decb;
    logger::log<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
               "DecodeAddress error. ConfidentialAddress prefix not registed. : address={}.",
               local_288);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8 = (undefined1  [8])&local_1c8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"DecodeAddress confidential address prefix not registed.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1d8);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1d8 = (undefined1  [8])0x220cb7;
  puStack_1d0 = (pointer)CONCAT44(puStack_1d0._4_4_,0xd8);
  local_1c8._M_allocated_capacity = 0x21decb;
  logger::log<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
             "DecodeAddress error. ConfidentialAddress prefix not found. : address={}.",local_288);
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1d8 = (undefined1  [8])&local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"DecodeAddress confidential address prefix not found.","");
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1d8);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ElementsConfidentialAddress::DecodeAddress(
    const std::string& confidential_address,
    const std::vector<AddressFormatData>& prefix_list) {
  std::vector<uint8_t> pubkey_data(Pubkey::kCompressedPubkeySize);
  std::string address;
  char* output = nullptr;

  if (confidential_address.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. confidential address empty."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError, "DecodeAddress confidential address empty.");
  }

  int ret = -1;
  uint32_t prefix = 0;
  std::string hrp;
  bool is_find_blinded_prefix = false;
  for (const auto& data : prefix_list) {
    for (const auto& format : GetBlindKeyPair()) {
      try {
        output = nullptr;

        // Get confidential_key
        if (format.is_segwit) {
          hrp = data.GetString(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_segwit_to_ec_public_key(
              confidential_address.c_str(), hrp.c_str(), pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret, hrp);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        } else {
          prefix = data.GetValue(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_to_ec_public_key(
              confidential_address.c_str(), prefix, pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        }

        if (ret != WALLY_OK) {
          // do nothing
        } else if (format.is_segwit) {
          ret = wally_confidential_addr_to_addr_segwit(
              confidential_address.c_str(), hrp.c_str(),
              data.GetString(format.prefix_key).c_str(), &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                data.GetString(format.prefix_key).c_str());
          }
        } else {
          ret = wally_confidential_addr_to_addr(
              confidential_address.c_str(), prefix, &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
          }
        }

        if (ret == WALLY_OK) {
          address = WallyUtil::ConvertStringAndFree(output);
          unblinded_address_ = Address(address, data);
          confidential_key_ = ConfidentialKey(ByteData(pubkey_data));
          address_ = confidential_address;
          return;
        }
      } catch (const CfdException& except) {
        // Ignore
        trace(
            CFD_LOG_SOURCE, "DecodeAddress exception={}",
            std::string(except.what()));
      }
    }
  }

  if (is_find_blinded_prefix) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not found."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not found.");
  } else {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not registed."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not registed.");
  }
}